

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O2

QSize __thiscall QToolBarSeparator::sizeHint(QToolBarSeparator *this)

{
  long lVar1;
  uint uVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,1,0);
  initStyleOption(this,&opt);
  pQVar3 = QWidget::style((QWidget *)this);
  uVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))
                    (pQVar3,0x38,&opt,*(undefined8 *)(*(long *)(this + 8) + 0x10));
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSize)((ulong)uVar2 * 0x100000001);
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarSeparator::sizeHint() const
{
    QStyleOption opt;
    initStyleOption(&opt);
    const int extent = style()->pixelMetric(QStyle::PM_ToolBarSeparatorExtent, &opt, parentWidget());
    return QSize(extent, extent);
}